

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_wrapper.h
# Opt level: O0

iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> * __thiscall
date::iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
          (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  value_type *pvVar1;
  size_t sVar2;
  bool bVar3;
  char_type cVar4;
  ulong uVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> local_28;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *local_18;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this_local;
  
  if ((this->m_position != 0xffffffffffffffff) &&
     (uVar5 = this->m_position + 1, this->m_position = uVar5, *this->m_cacheSize <= uVar5)) {
    local_18 = this;
    bVar3 = std::operator==(this->m_srcIt,this->m_srcEnd);
    if (bVar3) {
      this->m_position = 0xffffffffffffffff;
    }
    else {
      iVar6 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(this->m_srcIt,0);
      local_28._M_sbuf = iVar6._M_sbuf;
      local_28._M_c = iVar6._M_c;
      cVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*(&local_28);
      pvVar1 = this->m_cache;
      sVar2 = *this->m_cacheSize;
      *this->m_cacheSize = sVar2 + 1;
      pvVar1[sVar2] = cVar4;
    }
  }
  return this;
}

Assistant:

iterator_proxy& operator++()
    {
        if ((m_position == static_cast<std::size_t>(-1)) || (++m_position < m_cacheSize))
            return *this;

        if (m_srcIt == m_srcEnd)
        {
            m_position = static_cast<std::size_t>(-1);
            return *this;
        }

        m_cache[m_cacheSize++] = *(m_srcIt++);
        return *this;
    }